

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<unsigned_int,float>(Thread *this,UnopFunc<unsigned_int,_float> *f)

{
  uint uVar1;
  long lVar2;
  Simd<float,_(unsigned_char)__x04_> SVar3;
  SR result;
  Simd<float,_(unsigned_char)__x04_> val;
  Simd<unsigned_int,_(unsigned_char)__x04_> local_38;
  float local_28 [4];
  
  SVar3 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  local_28[0] = SVar3.v[0];
  local_28[1] = SVar3.v[1];
  local_28[2] = SVar3.v[2];
  local_28[3] = SVar3.v[3];
  lVar2 = 0;
  do {
    uVar1 = (*f)(*(float *)((long)local_28 + lVar2));
    *(uint *)((long)local_38.v + lVar2) = uVar1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,local_38);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}